

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode_bandpre.c
# Opt level: O0

int CVBandPrecInit(void *cvode_mem,sunindextype N,sunindextype mu,sunindextype ml)

{
  void *pvVar1;
  int iVar2;
  long *__ptr;
  long lVar3;
  SUNMatrix A;
  SUNMatrix p_Var4;
  SUNLinearSolver p_Var5;
  SUNContext_conflict in_RCX;
  SUNContext_conflict in_RDX;
  long in_RSI;
  CVodeMem in_RDI;
  int flag;
  sunindextype storagemu;
  sunindextype mlp;
  sunindextype mup;
  CVBandPrecData pdata;
  CVLsMem cvls_mem;
  CVodeMem cv_mem;
  SUNContext_conflict local_a0;
  SUNContext_conflict local_98;
  SUNContext_conflict sunctx;
  SUNContext_conflict in_stack_ffffffffffffff80;
  SUNContext_conflict cvode_mem_00;
  SUNContext_conflict ml_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  int local_4;
  
  if (in_RDI == (CVodeMem)0x0) {
    cvProcessError((CVodeMem)0x0,-1,0x46,"CVBandPrecInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                   ,"Integrator memory is NULL.");
    local_4 = -1;
  }
  else if (in_RDI->cv_lmem == (void *)0x0) {
    cvProcessError(in_RDI,-2,0x4f,"CVBandPrecInit",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                   ,
                   "Linear solver memory is NULL. One of the SPILS linear solvers must be attached."
                  );
    local_4 = -2;
  }
  else {
    pvVar1 = in_RDI->cv_lmem;
    if (in_RDI->cv_tempv->ops->nvgetarraypointer == (_func_sunrealtype_ptr_N_Vector *)0x0) {
      cvProcessError(in_RDI,-3,0x58,"CVBandPrecInit",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                     ,"A required vector operation is not implemented.");
      local_4 = -3;
    }
    else {
      __ptr = (long *)malloc(0x50);
      if (__ptr == (long *)0x0) {
        cvProcessError(in_RDI,-4,0x62,"CVBandPrecInit",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                       ,"A memory request failed.");
        local_4 = -4;
      }
      else {
        __ptr[9] = (long)in_RDI;
        *__ptr = in_RSI;
        lVar3 = in_RSI + -1;
        ml_00 = in_RDX;
        if ((long)in_RDX < 0) {
          ml_00 = (SUNContext_conflict)0x0;
        }
        if (lVar3 < (long)ml_00) {
          in_RDX = in_stack_ffffffffffffff80;
          cvode_mem_00 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          cvode_mem_00 = in_RDX;
          if ((long)in_RDX < 0) {
            in_RDX = (SUNContext_conflict)0x0;
            cvode_mem_00 = in_RDX;
          }
        }
        __ptr[2] = (long)cvode_mem_00;
        A = (SUNMatrix)(in_RSI + -1);
        sunctx = in_RCX;
        if ((long)in_RCX < 0) {
          sunctx = (SUNContext_conflict)0x0;
        }
        if ((long)A < (long)sunctx) {
          local_98 = (SUNContext_conflict)(in_RSI + -1);
        }
        else {
          local_a0 = in_RCX;
          if ((long)in_RCX < 0) {
            local_a0 = (SUNContext_conflict)0x0;
          }
          local_98 = local_a0;
        }
        __ptr[1] = (long)local_98;
        __ptr[8] = 0;
        __ptr[3] = 0;
        p_Var4 = SUNBandMatrixStorage
                           (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),lVar3,
                            (sunindextype)ml_00,(sunindextype)cvode_mem_00,in_RDX);
        __ptr[3] = (long)p_Var4;
        if (__ptr[3] == 0) {
          free(__ptr);
          cvProcessError(in_RDI,-4,0x77,"CVBandPrecInit",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                         ,"A memory request failed.");
          local_4 = -4;
        }
        else {
          __ptr[4] = 0;
          p_Var4 = SUNBandMatrixStorage
                             (CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),lVar3,
                              (sunindextype)ml_00,(sunindextype)cvode_mem_00,in_RDX);
          __ptr[4] = (long)p_Var4;
          if (__ptr[4] == 0) {
            SUNMatDestroy(__ptr[3]);
            free(__ptr);
            cvProcessError(in_RDI,-4,0x85,"CVBandPrecInit",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                           ,"A memory request failed.");
            local_4 = -4;
          }
          else {
            __ptr[5] = 0;
            p_Var5 = SUNLinSol_Band((N_Vector)in_RDX,A,sunctx);
            __ptr[5] = (long)p_Var5;
            if (__ptr[5] == 0) {
              SUNMatDestroy(__ptr[4]);
              SUNMatDestroy(__ptr[3]);
              free(__ptr);
              cvProcessError(in_RDI,-4,0x93,"CVBandPrecInit",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                             ,"A memory request failed.");
              local_4 = -4;
            }
            else {
              __ptr[6] = 0;
              lVar3 = N_VClone(in_RDI->cv_tempv);
              __ptr[6] = lVar3;
              if (__ptr[6] == 0) {
                SUNLinSolFree(__ptr[5]);
                SUNMatDestroy(__ptr[4]);
                SUNMatDestroy(__ptr[3]);
                free(__ptr);
                cvProcessError(in_RDI,-4,0xa2,"CVBandPrecInit",
                               "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                               ,"A memory request failed.");
                local_4 = -4;
              }
              else {
                __ptr[7] = 0;
                lVar3 = N_VClone(in_RDI->cv_tempv);
                __ptr[7] = lVar3;
                if (__ptr[7] == 0) {
                  SUNLinSolFree(__ptr[5]);
                  SUNMatDestroy(__ptr[4]);
                  SUNMatDestroy(__ptr[3]);
                  N_VDestroy(__ptr[6]);
                  free(__ptr);
                  cvProcessError(in_RDI,-4,0xb0,"CVBandPrecInit",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                                 ,"A memory request failed.");
                  local_4 = -4;
                }
                else {
                  iVar2 = SUNLinSolInitialize(__ptr[5]);
                  if (iVar2 == 0) {
                    if (*(long *)((long)pvVar1 + 0xe8) != 0) {
                      (**(code **)((long)pvVar1 + 0xe8))(in_RDI);
                    }
                    *(long **)((long)pvVar1 + 0xf0) = __ptr;
                    *(code **)((long)pvVar1 + 0xe8) = CVBandPrecFree;
                    local_4 = CVodeSetPreconditioner
                                        (cvode_mem_00,(CVLsPrecSetupFn)in_RDX,(CVLsPrecSolveFn)A);
                  }
                  else {
                    SUNLinSolFree(__ptr[5]);
                    SUNMatDestroy(__ptr[4]);
                    SUNMatDestroy(__ptr[3]);
                    N_VDestroy(__ptr[6]);
                    N_VDestroy(__ptr[7]);
                    free(__ptr);
                    cvProcessError(in_RDI,-9,0xc0,"CVBandPrecInit",
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/cvode/cvode_bandpre.c"
                                   ,"An error arose from a SUNBandLinearSolver routine.");
                    local_4 = -9;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

int CVBandPrecInit(void* cvode_mem, sunindextype N, sunindextype mu,
                   sunindextype ml)
{
  CVodeMem cv_mem;
  CVLsMem cvls_mem;
  CVBandPrecData pdata;
  sunindextype mup, mlp, storagemu;
  int flag;

  if (cvode_mem == NULL)
  {
    cvProcessError(NULL, CVLS_MEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_NULL);
    return (CVLS_MEM_NULL);
  }
  cv_mem = (CVodeMem)cvode_mem;

  /* Test if the CVLS linear solver interface has been attached */
  if (cv_mem->cv_lmem == NULL)
  {
    cvProcessError(cv_mem, CVLS_LMEM_NULL, __LINE__, __func__, __FILE__,
                   MSGBP_LMEM_NULL);
    return (CVLS_LMEM_NULL);
  }
  cvls_mem = (CVLsMem)cv_mem->cv_lmem;

  /* Test compatibility of NVECTOR package with the BAND preconditioner */
  if (cv_mem->cv_tempv->ops->nvgetarraypointer == NULL)
  {
    cvProcessError(cv_mem, CVLS_ILL_INPUT, __LINE__, __func__, __FILE__,
                   MSGBP_BAD_NVECTOR);
    return (CVLS_ILL_INPUT);
  }

  /* Allocate data memory */
  pdata = NULL;
  pdata = (CVBandPrecData)malloc(sizeof *pdata);
  if (pdata == NULL)
  {
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Load pointers and bandwidths into pdata block. */
  pdata->cvode_mem = cvode_mem;
  pdata->N         = N;
  pdata->mu = mup = SUNMIN(N - 1, SUNMAX(0, mu));
  pdata->ml = mlp = SUNMIN(N - 1, SUNMAX(0, ml));

  /* Initialize nfeBP counter */
  pdata->nfeBP = 0;

  /* Allocate memory for saved banded Jacobian approximation. */
  pdata->savedJ = NULL;
  pdata->savedJ = SUNBandMatrixStorage(N, mup, mlp, mup, cv_mem->cv_sunctx);
  if (pdata->savedJ == NULL)
  {
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded preconditioner. */
  storagemu     = SUNMIN(N - 1, mup + mlp);
  pdata->savedP = NULL;
  pdata->savedP = SUNBandMatrixStorage(N, mup, mlp, storagemu, cv_mem->cv_sunctx);
  if (pdata->savedP == NULL)
  {
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* Allocate memory for banded linear solver */
  pdata->LS = NULL;
  pdata->LS = SUNLinSol_Band(cv_mem->cv_tempv, pdata->savedP, cv_mem->cv_sunctx);
  if (pdata->LS == NULL)
  {
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* allocate memory for temporary N_Vectors */
  pdata->tmp1 = NULL;
  pdata->tmp1 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp1 == NULL)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }
  pdata->tmp2 = NULL;
  pdata->tmp2 = N_VClone(cv_mem->cv_tempv);
  if (pdata->tmp2 == NULL)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    N_VDestroy(pdata->tmp1);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_MEM_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_MEM_FAIL);
    return (CVLS_MEM_FAIL);
  }

  /* initialize band linear solver object */
  flag = SUNLinSolInitialize(pdata->LS);
  if (flag != SUN_SUCCESS)
  {
    SUNLinSolFree(pdata->LS);
    SUNMatDestroy(pdata->savedP);
    SUNMatDestroy(pdata->savedJ);
    N_VDestroy(pdata->tmp1);
    N_VDestroy(pdata->tmp2);
    free(pdata);
    pdata = NULL;
    cvProcessError(cv_mem, CVLS_SUNLS_FAIL, __LINE__, __func__, __FILE__,
                   MSGBP_SUNLS_FAIL);
    return (CVLS_SUNLS_FAIL);
  }

  /* make sure P_data is free from any previous allocations */
  if (cvls_mem->pfree) { cvls_mem->pfree(cv_mem); }

  /* Point to the new P_data field in the LS memory */
  cvls_mem->P_data = pdata;

  /* Attach the pfree function */
  cvls_mem->pfree = CVBandPrecFree;

  /* Attach preconditioner solve and setup functions */
  flag = CVodeSetPreconditioner(cvode_mem, CVBandPrecSetup, CVBandPrecSolve);
  return (flag);
}